

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O1

void __thiscall
GF2::Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::_Update
          (Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *this,
          iterator posPoly)

{
  _CPs *p_Var1;
  size_t *psVar2;
  iterator iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _Self __tmp;
  _List_node_base *p_Var6;
  ulong uVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _CPs newpairs;
  CritPair<8UL,_GF2::MOGrevlex<8UL>_> newpair;
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  local_98;
  _List_node_base *local_80;
  _List_node_base *local_78;
  _List_node_base *p_Stack_70;
  _List_node_base *local_68;
  _List_node_base *p_Stack_60;
  _List_node_base *local_58 [2];
  _CPs *local_48;
  _List_node_base *local_40;
  _I *local_38;
  
  p_Var1 = &this->_pairs;
  p_Var9 = (this->_pairs).
           super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var9 != (_List_node_base *)p_Var1) {
    if ((((ulong)posPoly._M_node[1]._M_next[1]._M_next & ~(ulong)p_Var9[3]._M_prev) == 0) &&
       (((ulong)p_Var9[3]._M_next & ~(ulong)p_Var9[2]._M_next) != 0)) {
      p_Var6 = p_Var9->_M_next;
      psVar2 = &(this->_pairs).
                super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var9,0x40);
      psVar2 = &(this->_stat).a_criterion;
      *psVar2 = *psVar2 + 1;
      p_Var9 = p_Var6;
    }
    else {
      p_Var9 = p_Var9->_M_next;
    }
  }
  local_98.
  super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
  local_98.
  super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var9 = (_List_node_base *)&this->_basis;
  iVar3._M_node =
       (this->_basis).
       super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
       .
       super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_98.
  super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_98.
       super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_80 = p_Var9;
  local_48 = p_Var1;
  if (iVar3._M_node != p_Var9) {
    p_Var6 = posPoly._M_node + 1;
    local_38 = &this->_reserve;
    local_40 = p_Var6;
    do {
      if (iVar3._M_node == posPoly._M_node) {
LAB_00139855:
        iVar3._M_node = (iVar3._M_node)->_M_next;
      }
      else {
        if (((ulong)p_Var6->_M_next[1]._M_next & ~(ulong)iVar3._M_node[1]._M_next[1]._M_next) != 0)
        {
          MP<8ul,GF2::MOGrevlex<8ul>>::ModGB<GF2::MOGrevlex<8ul>>
                    ((MP<8ul,GF2::MOGrevlex<8ul>> *)(iVar3._M_node + 1),
                     (MP<8UL,_GF2::MOGrevlex<8UL>_> *)p_Var6);
          goto LAB_00139855;
        }
        p_Var8 = (iVar3._M_node)->_M_next;
        iVar3 = MI<8UL,_GF2::MOGrevlex<8UL>_>::Splice(local_38,p_Var9,iVar3);
        p_Var9 = iVar3._M_node[1]._M_next[1]._M_next;
        p_Var6 = p_Var6->_M_next[1]._M_next;
        p_Var4 = (_List_node_base *)operator_new(0x40);
        p_Var4[1]._M_next = (_List_node_base *)0xffffffffffffffff;
        p_Var4[1]._M_prev = iVar3._M_node;
        p_Var4[2]._M_next = p_Var9;
        p_Var4[2]._M_prev = posPoly._M_node;
        p_Var4[3]._M_next = p_Var6;
        p_Var4[3]._M_prev = (_List_node_base *)((ulong)p_Var6 | (ulong)p_Var9);
        std::__detail::_List_node_base::_M_hook(p_Var4);
        local_98.
        super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
        ._M_impl._M_node._M_size =
             local_98.
             super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
             ._M_impl._M_node._M_size + 1;
        psVar2 = &(this->_stat).r_criterion;
        *psVar2 = *psVar2 + 1;
        iVar3._M_node = p_Var8;
        p_Var6 = local_40;
        p_Var9 = local_80;
      }
    } while (iVar3._M_node != p_Var9);
  }
  std::__cxx11::
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ::sort(&local_98);
  p_Var9 = (_List_node_base *)&local_98;
  std::__cxx11::
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ::merge(local_48,(list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    *)p_Var9);
  p_Var6 = (_List_node_base *)0x0;
  do {
    p_Var8 = (_List_node_base *)(1L << ((byte)p_Var6 & 0x3f));
    if (((ulong)posPoly._M_node[1]._M_next[1]._M_next >> ((ulong)p_Var6 & 0x3f) & 1) != 0) {
      p_Var4 = posPoly._M_node[1]._M_next[1]._M_next;
      p_Var5 = (_List_node_base *)operator_new(0x40);
      p_Var5[1]._M_next = p_Var6;
      p_Var5[1]._M_prev = (_List_node_base *)0x0;
      p_Var5[2]._M_next = p_Var8;
      p_Var5[2]._M_prev = posPoly._M_node;
      p_Var5[3]._M_next = p_Var4;
      p_Var5[3]._M_prev = (_List_node_base *)((ulong)p_Var8 | (ulong)p_Var4);
      std::__detail::_List_node_base::_M_hook(p_Var5);
      local_98.
      super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ._M_impl._M_node._M_size =
           local_98.
           super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ._M_impl._M_node._M_size + 1;
    }
    p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1);
  } while (p_Var6 != (_List_node_base *)0x8);
  p_Var6 = local_80->_M_next;
  p_Var8 = local_80;
  do {
    p_Var4 = local_98.
             super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var6 == p_Var8) {
      while (p_Var4 != p_Var9) {
        p_Var6 = p_Var4[1]._M_next;
        if (p_Var6 == (_List_node_base *)0xffffffffffffffff) {
          uVar7 = (ulong)p_Var4[3]._M_next & (ulong)p_Var4[2]._M_next;
        }
        else {
          uVar7 = 1L << ((byte)p_Var6 & 0x3f) & (ulong)(&p_Var4[3]._M_next)[(ulong)p_Var6 >> 6];
        }
        if (uVar7 == 0) {
          psVar2 = &(this->_stat).buch_criterion;
          *psVar2 = *psVar2 + 1;
          p_Var6 = p_Var4->_M_next;
          local_98.
          super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ._M_impl._M_node._M_size =
               local_98.
               super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ._M_impl._M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var4,0x40);
          p_Var4 = p_Var6;
        }
        else {
          p_Var4 = p_Var4->_M_next;
        }
      }
      std::__cxx11::
      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::sort(&local_98);
      std::__cxx11::
      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::merge(local_48,&local_98);
      p_Var9 = local_98.
               super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      while (p_Var9 != (_List_node_base *)&local_98) {
        p_Var6 = p_Var9->_M_next;
        operator_delete(p_Var9,0x40);
        p_Var9 = p_Var6;
      }
      return;
    }
    if (p_Var6 != posPoly._M_node) {
      local_78 = (_List_node_base *)0xffffffffffffffff;
      p_Stack_70 = p_Var6;
      local_68 = p_Var6[1]._M_next[1]._M_next;
      p_Stack_60 = posPoly._M_node;
      local_58[0] = posPoly._M_node[1]._M_next[1]._M_next;
      local_58[1] = (_List_node_base *)((ulong)local_58[0] | (ulong)local_68);
      while (p_Var5 = local_98.
                      super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next, p_Var4 != p_Var9) {
        p_Var8 = p_Var4[1]._M_next;
        if (((p_Var8 == (_List_node_base *)0xffffffffffffffff || p_Var8 == local_78) &&
            (((ulong)p_Var4[3]._M_prev & ~(ulong)local_58[1]) == 0)) &&
           (((ulong)posPoly._M_node[1]._M_next[1]._M_next &
            ~((ulong)p_Var6[1]._M_next[1]._M_next | (ulong)p_Var4[2]._M_next)) != 0)) {
          if ((p_Var8 != local_78) || (p_Var4[3]._M_prev != local_58[1])) {
            psVar2 = &(this->_stat).b_criterion;
            *psVar2 = *psVar2 + 1;
LAB_00139ab5:
            p_Var8 = local_80;
            if (p_Var4 != p_Var9) goto LAB_00139b8c;
            break;
          }
          psVar2 = &(this->_stat).c_criterion;
          *psVar2 = *psVar2 + 1;
          if (p_Var8 == (_List_node_base *)0xffffffffffffffff) {
            uVar7 = (ulong)p_Var4[3]._M_next & (ulong)p_Var4[2]._M_next;
          }
          else {
            uVar7 = 1L << ((byte)p_Var8 & 0x3f) & (ulong)(&p_Var4[3]._M_next)[(ulong)p_Var8 >> 6];
          }
          if (uVar7 == 0) goto LAB_00139ab5;
          if (local_78 == (_List_node_base *)0xffffffffffffffff) {
            uVar7 = (ulong)local_58[0] & (ulong)local_68;
          }
          else {
            uVar7 = 1L << ((byte)local_78 & 0x3f) & (ulong)local_58[(ulong)local_78 >> 6];
          }
          if (uVar7 != 0) goto LAB_00139ab5;
          p_Var8 = p_Var4->_M_next;
          local_98.
          super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ._M_impl._M_node._M_size =
               local_98.
               super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ._M_impl._M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var4,0x40);
          p_Var4 = p_Var8;
        }
        else {
          p_Var4 = (((_List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        }
      }
      while (p_Var5 != p_Var9) {
        if (((local_78 == (_List_node_base *)0xffffffffffffffff) || (local_78 == p_Var5[1]._M_next))
           && ((((ulong)local_58[1] & ~(ulong)p_Var5[3]._M_prev) == 0 &&
               (((local_78 != p_Var5[1]._M_next || (local_58[1] != p_Var5[3]._M_prev)) &&
                (((ulong)posPoly._M_node[1]._M_next[1]._M_next &
                 ~((ulong)p_Var6[1]._M_next[1]._M_next | (ulong)p_Var5[2]._M_next)) != 0)))))) {
          p_Var8 = p_Var5->_M_next;
          local_98.
          super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ._M_impl._M_node._M_size =
               local_98.
               super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ._M_impl._M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var5,0x40);
          psVar2 = &(this->_stat).b_criterion;
          *psVar2 = *psVar2 + 1;
          p_Var5 = p_Var8;
        }
        else {
          p_Var5 = p_Var5->_M_next;
        }
      }
      p_Var8 = (_List_node_base *)operator_new(0x40);
      p_Var8[1]._M_next = local_78;
      p_Var8[1]._M_prev = p_Stack_70;
      p_Var8[2]._M_next = local_68;
      p_Var8[2]._M_prev = p_Stack_60;
      p_Var8[3]._M_next = local_58[0];
      p_Var8[3]._M_prev = local_58[1];
      std::__detail::_List_node_base::_M_hook(p_Var8);
      local_98.
      super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ._M_impl._M_node._M_size =
           local_98.
           super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ._M_impl._M_node._M_size + 1;
      p_Var8 = local_80;
    }
LAB_00139b8c:
    p_Var6 = p_Var6->_M_next;
  } while( true );
}

Assistant:

void _Update(typename _I::iterator posPoly)
	{
		// критерий A:
		// если LM(poly) | [LM(f_i), LM(f_j)] и (f_i, f_j) не является r-парой,
		// то (f_i, f_j) можно исключить
		auto posPair = _pairs.begin();
		for (; posPair != _pairs.end();)
			if ((posPoly->LM() | posPair->lcm) && !posPair->IsRPair())
				posPair = _pairs.erase(posPair), _stat.a_criterion++;
			else 
				++posPair;

		// формируем r-пары (f_i, poly), где LM(poly) | LM(f_i)
		// удаляем многочлены f_i
		// .
		// если LM(poly) \not| LM(f_i), то LM(poly) \neq LM(f_i)
		// поэтому LM(f_i mod poly) == LM(f_i) и f_i можно заменить 
		// на f_i mod poly без изменения характеристики lcm всех S-многочленов,
		// в которые входит f_i
		_CPs newpairs;
		// цикл по многочленам базиса
		_Iterator posBasis = _basis.begin();
		for (; posBasis != _basis.end();)
		{
			if (posPoly == posBasis)
			{
				++posBasis;
				continue;
			}
			// подходящий для r-пары многочлен *posBasis?
			if (posPoly->LM() | posBasis->LM())
			{
				// переводим многочлен в резерв
				_Iterator posReserve = _reserve.Splice(_basis, posBasis++);
				// добавляем новую критическую пару
				newpairs.push_front(_CP(posReserve, posPoly));
				_stat.r_criterion++;
			}
			// упрощаем *posBasis
			else posBasis->Mod(*posPoly), ++posBasis;
		}
		// добавляем r-пары в список критических пар
		newpairs.sort();
		_pairs.merge(newpairs);

		// добавляем пары (x_i^2 - x_i, poly)  
		// с учетом первого критерия Бухбергера рассматриваем только
		// такие i, что LM(poly) содержит x_i
		for (size_t var = 0; var < _n; var++)
			// есть зацепление?
			if (posPoly->LM().Test(var))
				newpairs.push_front(_CP(var, posPoly));

		// добавляем пары (f, poly), f -- явные многочлены _basis, 
		// в список пар с учетом критериев B, С:
		// если в _basis найдется f_i т.ч. 
		// [LM(f_i), LM(poly)] | [LM(f_j), LM(poly)],
		// и LM(poly) не делит [LM(f_i), LM(f_j)] или одна из пар (f_i, f_j), 
		// (f_j,f_i) уже обработана, то 
		// a) пару (f_j, poly) можно исключить, 
		//    если [LM(f_i), LM(poly)] != [LM(f_j), LM(poly)] (критерий B);
		// б) одну из пар (f_i, poly), (f_j, poly) можно исключить,
		//    если [LM(f_i), LM(poly)] == [LM(f_j), LM(poly)] (критерий С);
		// .
		// важно: f_i не может быть уравнением поля
		// важно: при применении критерия С в первую очередь исключается пара
		//		  с зацеплением
		// важно: (f_j, poly) не может быть r-парой
		for (posBasis = _basis.begin(); posBasis != _basis.end(); ++posBasis)
		{
			if (posBasis == posPoly) continue;
			// добавляемая пара
			_CP newpair(posBasis, posPoly);
			// цикл по имеющимся парам
			posPair = newpairs.begin();
			for (; posPair != newpairs.end();)
			{
				// выполняются условия делимости?
				if ((*posPair | newpair) && 
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
				{
					// новая пара исключается критерием B?
					if (*posPair != newpair)
					{
						_stat.b_criterion++;
						break;
					}
					// действует критерий C
					_stat.c_criterion++;
					// новая пара исключается критерием C?
					if (posPair->IsRelPrime() || !newpair.IsRelPrime())
						break;
					// новая пара исключает пару *posPair по критерию C
					posPair = newpairs.erase(posPair);
				}
				else
					++posPair;
			}
			// пара исключена критерием B или С? к следующей
			if (posPair != newpairs.end()) 
				continue;
			// снова цикл по имеющимся парам: пробуем их исключить
			for (posPair = newpairs.begin(); posPair != newpairs.end();)
				// критерий B исключает *posPair?
				if ((newpair | *posPair) && newpair != *posPair &&
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
						posPair = newpairs.erase(posPair), _stat.b_criterion++;
				else
					++posPair;
			// добавляем пару
			newpairs.insert(posPair, newpair);
		}
		// применяем первый критерий Бухбергера: удаляем пары без зацепления
		for (posPair = newpairs.begin(); posPair != newpairs.end();)
			if (posPair->IsRelPrime())
				_stat.buch_criterion++,
				posPair = newpairs.erase(posPair);
			else
				++posPair;
		// слияние списков пар
		newpairs.sort();
		_pairs.merge(newpairs);
	}